

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setMaximumDate(QDateTimeEdit *this,QDate max)

{
  long lVar1;
  bool bVar2;
  QDateTimeEditPrivate *dt;
  undefined8 in_RSI;
  QTime time;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *this_00;
  QDate in_stack_ffffffffffffffe8;
  
  time.mds = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  dt = d_func((QDateTimeEdit *)0x55937f);
  bVar2 = QDate::isValid((QDate *)dt);
  if (bVar2) {
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue(in_RDI,in_stack_ffffffffffffffe8,time);
    setMaximumDateTime((QDateTimeEdit *)this_00,(QDateTime *)dt);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setMaximumDate(QDate max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(max, d->maximum.toTime()));
}